

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevT.cpp
# Opt level: O1

void __thiscall OpenMD::ChebyshevT::GeneratePolynomials(ChebyshevT *this,int maxPower)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict *pmVar2;
  vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *this_00;
  long lVar3;
  DoublePolynomial twoX;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_f8;
  long local_c8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  GenerateFirstTwoTerms(this);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_impl._0_4_ = 1;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)&local_90,(key_type *)&local_f8);
  *pmVar2 = 2.0;
  if (1 < maxPower) {
    p_Var1 = &local_f8._M_impl.super__Rb_tree_header;
    this_00 = &this->polyList_;
    local_c8 = (ulong)(maxPower + 1) * 0x30 + -0x60;
    lVar3 = 0;
    do {
      local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      operator*((Polynomial<double> *)&local_60,
                (Polynomial<double> *)
                ((long)&(this_00->
                        super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[1].polyPairMap_._M_t._M_impl +
                lVar3),(Polynomial<double> *)&local_90);
      operator-((Polynomial<double> *)&local_c0,(Polynomial<double> *)&local_60,
                (Polynomial<double> *)
                ((long)&(((this_00->
                          super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->polyPairMap_)._M_t._M_impl +
                lVar3));
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::clear(&local_f8);
      if (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        local_f8._M_impl.super__Rb_tree_header._M_header._M_color =
             local_c0._M_impl.super__Rb_tree_header._M_header._M_color;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
             local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c0._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
        ;
        local_f8._M_impl.super__Rb_tree_header._M_node_count =
             local_c0._M_impl.super__Rb_tree_header._M_node_count;
        local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c0._M_impl.super__Rb_tree_header._M_header;
        local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_60);
      std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::
      push_back(this_00,(value_type *)&local_f8);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_f8);
      lVar3 = lVar3 + 0x30;
    } while (local_c8 != lVar3);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void ChebyshevT::GeneratePolynomials(int maxPower) {
    GenerateFirstTwoTerms();

    DoublePolynomial twoX;
    twoX.setCoefficient(1, 2.0);

    // recursive generate the high order term of Chebyshev Polynomials
    // Cn+1(x) = Cn(x) * 2x - Cn-1(x)
    for (int i = 2; i <= maxPower; ++i) {
      DoublePolynomial cn;

      cn = polyList_[i - 1] * twoX - polyList_[i - 2];
      polyList_.push_back(cn);
    }
  }